

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

float frandGaussian(float mu,float sigma)

{
  long *in_FS_OFFSET;
  float in_XMM0_Da;
  float fVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  float in_XMM1_Da;
  float z0;
  float t;
  float u2;
  float u1;
  undefined4 local_4;
  
  *(byte *)(*in_FS_OFFSET + -4) = (*(byte *)(*in_FS_OFFSET + -4) ^ 0xff) & 1;
  if ((*(byte *)(*in_FS_OFFSET + -4) & 1) == 0) {
    fVar1 = *(float *)(*in_FS_OFFSET + -8);
  }
  else {
    fVar1 = frand();
    fVar2 = frand();
    dVar3 = log((double)(1.0 - fVar1));
    dVar3 = sqrt(dVar3 * -2.0);
    dVar4 = cos((double)(fVar2 * 6.2831855));
    fVar1 = (float)((double)(float)dVar3 * dVar4);
    dVar4 = sin((double)(fVar2 * 6.2831855));
    *(float *)(*in_FS_OFFSET + -8) = (float)((double)(float)dVar3 * dVar4);
  }
  local_4 = fVar1 * in_XMM1_Da + in_XMM0_Da;
  return local_4;
}

Assistant:

float frandGaussian(float mu, float sigma) {
	static const float two_pi = 2.0*3.14159265358979323846;

	thread_local float z1;
	thread_local bool generate;
	generate = !generate;

	if (!generate)
	   return z1 * sigma + mu;

	float u1 = frand();
    float u2 = frand();

    float t = sqrt(-2.0f * log(1.0f - u1));

	float z0 = t*cos(two_pi*u2);
	z1 = t*sin(two_pi*u2);

	return z0 * sigma + mu;
}